

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void propagatemark(global_State *g)

{
  byte bVar1;
  lua_State *L;
  Table *events;
  GCObject *pGVar2;
  CallInfo *pCVar3;
  lua_CFunction p_Var4;
  StkId pTVar5;
  bool bVar6;
  lua_Alloc *pp_Var7;
  int iVar8;
  TValue *pTVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  global_State *pgVar14;
  CClosure *cl;
  GCObject **ppGVar15;
  long lVar16;
  ulong uVar17;
  StkId pTVar18;
  global_State *pgVar19;
  bool bVar20;
  
  L = (lua_State *)g->gray;
  bVar1 = L->marked;
  L->marked = bVar1 | 4;
  switch(L->tt) {
  case '\x05':
    g->gray = (GCObject *)L->stack_last;
    events = (Table *)L->oldpc;
    if ((events == (Table *)0x0) || ((events->flags & 8) != 0)) {
      pTVar9 = (TValue *)0x0;
    }
    else {
      pTVar9 = luaT_gettm(events,TM_MODE,g->tmname[3]);
    }
    pGVar2 = (GCObject *)L->oldpc;
    if ((pGVar2 != (GCObject *)0x0) && ((pGVar2->marked & 3) != 0)) {
      reallymarkobject(g,pGVar2);
    }
    if ((pTVar9 == (TValue *)0x0) || ((pTVar9->tt_ & 0xfU) != 4)) {
LAB_0010c025:
      bVar1 = *(byte *)((long)&L->nci + 1);
      pgVar19 = L->l_G;
      if (*(int *)&L->status != 0) {
        lVar10 = 8;
        uVar13 = 0;
        do {
          if (((*(byte *)((long)&L->top->value_ + lVar10) & 0x40) != 0) &&
             (pGVar2 = *(GCObject **)((long)L->top + lVar10 + -8), (pGVar2->marked & 3) != 0)) {
            reallymarkobject(g,pGVar2);
          }
          uVar13 = uVar13 + 1;
          lVar10 = lVar10 + 0x10;
        } while (uVar13 < *(uint *)&L->status);
      }
      for (pgVar14 = L->l_G;
          pgVar14 < (global_State *)(&pgVar19->frealloc + (long)(1 << (bVar1 & 0x1f)) * 4);
          pgVar14 = (global_State *)&pgVar14->GCmemtrav) {
        if (*(int *)&pgVar14->ud == 0) {
          if (((pgVar14->GCdebt & 0x40) != 0) && ((*(byte *)(pgVar14->totalbytes + 9) & 3) != 0)) {
            *(undefined4 *)&pgVar14->GCdebt = 10;
          }
        }
        else {
          if (((pgVar14->GCdebt & 0x40) != 0) &&
             ((((GCObject *)pgVar14->totalbytes)->marked & 3) != 0)) {
            reallymarkobject(g,(GCObject *)pgVar14->totalbytes);
          }
          if ((((ulong)pgVar14->ud & 0x40) != 0) &&
             ((((GCObject *)pgVar14->frealloc)->marked & 3) != 0)) {
            reallymarkobject(g,(GCObject *)pgVar14->frealloc);
          }
        }
      }
    }
    else {
      p_Var4 = (pTVar9->value_).f;
      pcVar11 = strchr((char *)(p_Var4 + 0x18),0x6b);
      pcVar12 = strchr((char *)(p_Var4 + 0x18),0x76);
      if (pcVar11 == (char *)0x0 && pcVar12 == (char *)0x0) goto LAB_0010c025;
      L->marked = L->marked & 0xfb;
      if (pcVar11 == (char *)0x0) {
        bVar1 = *(byte *)((long)&L->nci + 1);
        bVar20 = *(int *)&L->status != 0;
        if (bVar1 != 0x1f) {
          pgVar19 = L->l_G;
          pp_Var7 = &pgVar19->frealloc;
          do {
            if (*(int *)&pgVar19->ud == 0) {
              if (((pgVar19->GCdebt & 0x40) != 0) && ((*(byte *)(pgVar19->totalbytes + 9) & 3) != 0)
                 ) {
                *(undefined4 *)&pgVar19->GCdebt = 10;
              }
            }
            else {
              if (((pgVar19->GCdebt & 0x40) != 0) &&
                 ((((GCObject *)pgVar19->totalbytes)->marked & 3) != 0)) {
                reallymarkobject(g,(GCObject *)pgVar19->totalbytes);
              }
              bVar6 = !bVar20;
              bVar20 = true;
              if (bVar6) {
                iVar8 = iscleared(g,(TValue *)pgVar19);
                bVar20 = iVar8 != 0;
              }
            }
            pgVar19 = (global_State *)&pgVar19->GCmemtrav;
          } while (pgVar19 < pp_Var7 + (long)(1 << (bVar1 & 0x1f)) * 4);
        }
        if (g->gcstate == '\0') {
          L->stack_last = (StkId)g->grayagain;
          g->grayagain = (GCObject *)L;
        }
        else if (bVar20) {
          L->stack_last = (StkId)g->weak;
          g->weak = (GCObject *)L;
        }
      }
      else if (pcVar12 == (char *)0x0) {
        traverseephemeron(g,(Table *)L);
      }
      else {
        L->stack_last = (StkId)g->allweak;
        g->allweak = (GCObject *)L;
      }
    }
    if (L->ci == (CallInfo *)0x0) {
      lVar10 = 0;
    }
    else {
      lVar10 = (long)(1 << (*(byte *)((long)&L->nci + 1) & 0x1f)) << 5;
    }
    lVar10 = (ulong)*(uint *)&L->status * 0x10 + lVar10 + 0x38;
    break;
  case '\x06':
    g->gray = (GCObject *)L->top;
    pgVar19 = L->l_G;
    if ((pgVar19 != (global_State *)0x0) && (((ulong)pgVar19->ud & 0x300) != 0)) {
      reallymarkobject(g,(GCObject *)pgVar19);
    }
    bVar1 = (byte)L->nci;
    uVar13 = (ulong)bVar1;
    if (bVar1 != 0) {
      uVar17 = 0;
      do {
        pCVar3 = (&L->ci)[uVar17];
        if (pCVar3 != (CallInfo *)0x0) {
          pTVar18 = pCVar3->func;
          if ((pTVar18 == (StkId)&pCVar3->previous) || (g->gcstate == '\b')) {
            if (((pTVar18->tt_ & 0x40) != 0) && ((((pTVar18->value_).gc)->marked & 3) != 0)) {
              reallymarkobject(g,(pTVar18->value_).gc);
            }
          }
          else {
            *(undefined4 *)&pCVar3->next = 1;
          }
        }
        uVar17 = uVar17 + 1;
        uVar13 = (ulong)(byte)L->nci;
      } while (uVar17 < uVar13);
    }
    lVar10 = uVar13 * 8 + 0x20;
    break;
  case '\a':
    goto switchD_0010bcfd_caseD_7;
  case '\b':
    g->gray = L->gclist;
    L->gclist = g->grayagain;
    g->grayagain = (GCObject *)L;
    L->marked = bVar1 & 0xfb;
    pTVar18 = L->stack;
    if (pTVar18 == (StkId)0x0) {
      lVar10 = 1;
    }
    else {
      for (; pTVar18 < L->top; pTVar18 = pTVar18 + 1) {
        if (((pTVar18->tt_ & 0x40) != 0) && ((((pTVar18->value_).gc)->marked & 3) != 0)) {
          reallymarkobject(g,(pTVar18->value_).gc);
        }
      }
      if (g->gcstate == '\b') {
        iVar8 = L->stacksize;
        pTVar5 = L->stack;
        for (; pTVar18 < pTVar5 + iVar8; pTVar18 = pTVar18 + 1) {
          pTVar18->tt_ = 0;
        }
        if ((L->twups == L) && (L->openupval != (UpVal *)0x0)) {
          L->twups = g->twups;
          g->twups = L;
        }
      }
      else if (g->gckind != '\x01') {
        luaD_shrinkstack(L);
      }
      lVar10 = (long)L->stacksize * 0x10 + (ulong)L->nci * 0x48 + 0xd0;
    }
    break;
  case '\t':
    g->gray = (GCObject *)(L->base_ci).previous;
    pTVar18 = (L->base_ci).func;
    if ((pTVar18 != (StkId)0x0) && ((pTVar18->tt_ & 0x300) != 0)) {
      (L->base_ci).func = (StkId)0x0;
    }
    pGVar2 = (GCObject *)(L->base_ci).top;
    if ((pGVar2 != (GCObject *)0x0) && ((pGVar2->marked & 3) != 0)) {
      reallymarkobject(g,pGVar2);
    }
    if (0 < *(int *)((long)&L->top + 4)) {
      lVar16 = 8;
      lVar10 = 0;
      do {
        if (((*(byte *)((long)&L->stack_last->value_ + lVar16) & 0x40) != 0) &&
           (pGVar2 = *(GCObject **)((long)L->stack_last + lVar16 + -8), (pGVar2->marked & 3) != 0))
        {
          reallymarkobject(g,pGVar2);
        }
        lVar10 = lVar10 + 1;
        lVar16 = lVar16 + 0x10;
      } while (lVar10 < *(int *)((long)&L->top + 4));
    }
    if (0 < *(int *)&L->top) {
      lVar16 = 0;
      lVar10 = 0;
      do {
        pGVar2 = *(GCObject **)((long)L->errorJmp->b[0].__jmpbuf + lVar16 + -8);
        if ((pGVar2 != (GCObject *)0x0) && ((pGVar2->marked & 3) != 0)) {
          reallymarkobject(g,pGVar2);
        }
        lVar10 = lVar10 + 1;
        lVar16 = lVar16 + 0x10;
      } while (lVar10 < *(int *)&L->top);
    }
    if (0 < *(int *)&L->ci) {
      lVar10 = 0;
      do {
        pGVar2 = (GCObject *)(&L->openupval->v)[lVar10];
        if ((pGVar2 != (GCObject *)0x0) && ((pGVar2->marked & 3) != 0)) {
          reallymarkobject(g,pGVar2);
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < *(int *)&L->ci);
    }
    iVar8 = *(int *)((long)&L->ci + 4);
    if (0 < iVar8) {
      lVar16 = 0;
      lVar10 = 0;
      do {
        pGVar2 = *(GCObject **)((long)&L->twups->next + lVar16);
        if ((pGVar2 != (GCObject *)0x0) && ((pGVar2->marked & 3) != 0)) {
          reallymarkobject(g,pGVar2);
        }
        lVar10 = lVar10 + 1;
        iVar8 = *(int *)((long)&L->ci + 4);
        lVar16 = lVar16 + 0x10;
      } while (lVar10 < iVar8);
    }
    lVar10 = (long)((iVar8 + *(int *)((long)&L->top + 4) + *(int *)&L->top) * 0x10 +
                    (*(int *)((long)&L->l_G + 4) + *(int *)&L->l_G) * 4 + *(int *)&L->ci * 8 + 0x78)
    ;
    break;
  default:
    if (L->tt != '&') {
      return;
    }
    g->gray = (GCObject *)L->top;
    bVar1 = (byte)L->nci;
    if (bVar1 != 0) {
      ppGVar15 = (GCObject **)&L->oldpc;
      uVar13 = 0;
      do {
        if ((((ulong)*ppGVar15 & 0x40) != 0) &&
           (((ulong)((CallInfo *)ppGVar15[-1])->top & 0x300) != 0)) {
          reallymarkobject(g,ppGVar15[-1]);
        }
        uVar13 = uVar13 + 1;
        bVar1 = (byte)L->nci;
        ppGVar15 = ppGVar15 + 2;
      } while (uVar13 < bVar1);
    }
    lVar10 = (ulong)bVar1 * 0x10 + 0x20;
  }
  g->GCmemtrav = g->GCmemtrav + lVar10;
switchD_0010bcfd_caseD_7:
  return;
}

Assistant:

static void propagatemark(global_State *g) {
    lu_mem size;
    GCObject *o = g->gray;
    lua_assert(isgray(o));
    gray2black(o);
    switch (o->tt) {
        case LUA_TTABLE: {
            Table *h = gco2t(o);
            g->gray = h->gclist;  /* remove from 'gray' list */
            size = traversetable(g, h);
            break;
        }
        case LUA_TLCL: {
            LClosure *cl = gco2lcl(o);
            g->gray = cl->gclist;  /* remove from 'gray' list */
            size = traverseLclosure(g, cl);
            break;
        }
        case LUA_TCCL: {
            CClosure *cl = gco2ccl(o);
            g->gray = cl->gclist;  /* remove from 'gray' list */
            size = traverseCclosure(g, cl);
            break;
        }
        case LUA_TTHREAD: {
            lua_State *th = gco2th(o);
            g->gray = th->gclist;  /* remove from 'gray' list */
            linkgclist(th, g->grayagain);  /* insert into 'grayagain' list */
            black2gray(o);
            size = traversethread(g, th);
            break;
        }
        case LUA_TPROTO: {
            Proto *p = gco2p(o);
            g->gray = p->gclist;  /* remove from 'gray' list */
            size = traverseproto(g, p);
            break;
        }
        default:
            lua_assert(0);
            return;
    }
    g->GCmemtrav += size;
}